

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O1

int check_block_sizes(test_state *state,int id,int id_len)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = 8;
  do {
    state->strm->block_size = uVar5;
    iVar1 = (int)(state->buf_len / (ulong)((long)(int)uVar5 * (long)state->bytes_per_sample));
    iVar4 = 0x1000;
    if (iVar1 < 0x1000) {
      iVar4 = iVar1;
    }
    if (0 < iVar1) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        state->strm->rsi = uVar3;
        iVar1 = (*state->codec)(state);
        if (iVar1 != 0) {
          return iVar1;
        }
        uVar2 = (uint)(*state->cbuf >> (8U - (char)id_len & 0x1f));
        if (uVar2 != id) {
          printf("%s: block of size %i created with ID:%x, expected %x.\n","\x1b[0;31mFAIL\x1b[0m",
                 (ulong)uVar5,(ulong)uVar2,id);
          return 99;
        }
      } while ((int)uVar3 < iVar4);
    }
    bVar6 = 0x20 < uVar5;
    uVar5 = uVar5 * 2;
    if (bVar6) {
      return 0;
    }
  } while( true );
}

Assistant:

int check_block_sizes(struct test_state *state, int id, int id_len)
{
    int bs, status, rsi, max_rsi;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;

        max_rsi = (int)(state->buf_len / (bs * state->bytes_per_sample));
        if (max_rsi > 4096)
            max_rsi = 4096;

        for (rsi = 1; rsi <= max_rsi; rsi++) {
            state->strm->rsi = rsi;
            status = state->codec(state);
            if (status)
                return status;

            if ((state->cbuf[0] >> (8 - id_len)) != id) {
                printf(
                    "%s: block of size %i created with ID:%x, expected %x.\n",
                    CHECK_FAIL, bs, state->cbuf[0] >> (8 - id_len), id
                    );
                return 99;
            }
        }
    }
    return 0;
}